

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoystickImpl.cpp
# Opt level: O0

bool anon_unknown.dwarf_102e87::isJoystick(udev_device *udevDevice)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  long in_RDI;
  char *idClass;
  char *devnode;
  bool local_1;
  
  if (in_RDI == 0) {
    local_1 = false;
  }
  else {
    pcVar1 = (char *)udev_device_get_devnode(in_RDI);
    if (pcVar1 == (char *)0x0) {
      local_1 = false;
    }
    else {
      pcVar1 = strstr(pcVar1,"/js");
      if (pcVar1 == (char *)0x0) {
        local_1 = false;
      }
      else {
        lVar2 = udev_device_get_property_value(in_RDI,"ID_INPUT_JOYSTICK");
        if (lVar2 == 0) {
          lVar2 = udev_device_get_property_value(in_RDI,"ID_INPUT_ACCELEROMETER");
          if ((((lVar2 == 0) &&
               (lVar2 = udev_device_get_property_value(in_RDI,"ID_INPUT_KEY"), lVar2 == 0)) &&
              (lVar2 = udev_device_get_property_value(in_RDI,"ID_INPUT_KEYBOARD"), lVar2 == 0)) &&
             (((lVar2 = udev_device_get_property_value(in_RDI,"ID_INPUT_MOUSE"), lVar2 == 0 &&
               (lVar2 = udev_device_get_property_value(in_RDI,"ID_INPUT_TABLET"), lVar2 == 0)) &&
              ((lVar2 = udev_device_get_property_value(in_RDI,"ID_INPUT_TOUCHPAD"), lVar2 == 0 &&
               (lVar2 = udev_device_get_property_value(in_RDI,"ID_INPUT_TOUCHSCREEN"), lVar2 == 0)))
              ))) {
            pcVar1 = (char *)udev_device_get_property_value(in_RDI,"ID_CLASS");
            if (pcVar1 != (char *)0x0) {
              pcVar3 = strstr(pcVar1,"joystick");
              if (pcVar3 != (char *)0x0) {
                return true;
              }
              pcVar3 = strstr(pcVar1,"accelerometer");
              if ((((pcVar3 != (char *)0x0) ||
                   (pcVar3 = strstr(pcVar1,"key"), pcVar3 != (char *)0x0)) ||
                  ((pcVar3 = strstr(pcVar1,"keyboard"), pcVar3 != (char *)0x0 ||
                   (((pcVar3 = strstr(pcVar1,"mouse"), pcVar3 != (char *)0x0 ||
                     (pcVar3 = strstr(pcVar1,"tablet"), pcVar3 != (char *)0x0)) ||
                    (pcVar3 = strstr(pcVar1,"touchpad"), pcVar3 != (char *)0x0)))))) ||
                 (pcVar1 = strstr(pcVar1,"touchscreen"), pcVar1 != (char *)0x0)) {
                return false;
              }
            }
            local_1 = true;
          }
          else {
            local_1 = false;
          }
        }
        else {
          local_1 = true;
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool isJoystick(udev_device* udevDevice)
    {
        // If anything goes wrong, we go safe and return true

        // No device to check, assume not a joystick
        if (!udevDevice)
            return false;

        const char* devnode = udev_device_get_devnode(udevDevice);

        // We only consider devices with a device node
        if (!devnode)
            return false;

        // SFML doesn't support evdev yet, so make sure we only handle /js nodes
        if (!std::strstr(devnode, "/js"))
            return false;

        // Check if this device is a joystick
        if (udev_device_get_property_value(udevDevice, "ID_INPUT_JOYSTICK"))
            return true;

        // Check if this device is something that isn't a joystick
        // We do this because the absence of any ID_INPUT_ property doesn't
        // necessarily mean that the device isn't a joystick, whereas the
        // presence of any ID_INPUT_ property that isn't ID_INPUT_JOYSTICK does
        if (udev_device_get_property_value(udevDevice, "ID_INPUT_ACCELEROMETER") ||
            udev_device_get_property_value(udevDevice, "ID_INPUT_KEY") ||
            udev_device_get_property_value(udevDevice, "ID_INPUT_KEYBOARD") ||
            udev_device_get_property_value(udevDevice, "ID_INPUT_MOUSE") ||
            udev_device_get_property_value(udevDevice, "ID_INPUT_TABLET") ||
            udev_device_get_property_value(udevDevice, "ID_INPUT_TOUCHPAD") ||
            udev_device_get_property_value(udevDevice, "ID_INPUT_TOUCHSCREEN"))
            return false;

        // On some platforms (older udev), ID_INPUT_ properties are not present, instead
        // the system makes use of the ID_CLASS property to identify the device class
        const char* idClass = udev_device_get_property_value(udevDevice, "ID_CLASS");

        if (idClass)
        {
            // Check if the device class matches joystick
            if (std::strstr(idClass, "joystick"))
                return true;

            // Check if the device class matches something that isn't a joystick
            // Rationale same as above
            if (std::strstr(idClass, "accelerometer") ||
                std::strstr(idClass, "key") ||
                std::strstr(idClass, "keyboard") ||
                std::strstr(idClass, "mouse") ||
                std::strstr(idClass, "tablet") ||
                std::strstr(idClass, "touchpad") ||
                std::strstr(idClass, "touchscreen"))
                return false;
        }

        // At this point, assume it is a joystick
        return true;
    }